

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::Clause::Clause(Clause *this,vec<Minisat::Lit,_int> *ps,bool use_extra,bool learnt)

{
  Size SVar1;
  anon_struct_4_5_613047fb_for_header *paVar2;
  int local_20;
  int i;
  bool learnt_local;
  bool use_extra_local;
  vec<Minisat::Lit,_int> *ps_local;
  Clause *this_local;
  
  this->header = (anon_struct_4_5_613047fb_for_header)((uint)this->header & 0xfffffffc);
  this->header = (anon_struct_4_5_613047fb_for_header)
                 ((uint)this->header & 0xfffffffb | (uint)learnt << 2);
  this->header = (anon_struct_4_5_613047fb_for_header)
                 ((uint)this->header & 0xfffffff7 | (uint)use_extra << 3);
  this->header = (anon_struct_4_5_613047fb_for_header)((uint)this->header & 0xffffffef);
  SVar1 = vec<Minisat::Lit,_int>::size(ps);
  this->header = (anon_struct_4_5_613047fb_for_header)((uint)this->header & 0x1f | SVar1 << 5);
  for (local_20 = 0; SVar1 = vec<Minisat::Lit,_int>::size(ps), local_20 < SVar1;
      local_20 = local_20 + 1) {
    paVar2 = (anon_struct_4_5_613047fb_for_header *)vec<Minisat::Lit,_int>::operator[](ps,local_20);
    this[(long)local_20 + 1].header = *paVar2;
  }
  if (((uint)this->header >> 3 & 1) != 0) {
    if (((uint)this->header >> 2 & 1) == 0) {
      calcAbstraction(this);
    }
    else {
      this[(ulong)((uint)this->header >> 5) + 1].header = (anon_struct_4_5_613047fb_for_header)0x0;
    }
  }
  return;
}

Assistant:

Clause(const vec<Lit>& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();

        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = 0;
            else
                calcAbstraction();
    }
    }